

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

int gazemu(monst *mtmp,attack *mattk)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  int tmp_2;
  char *line;
  uint uVar10;
  int tmp;
  int iVar11;
  ulong xtime;
  
  bVar1 = mattk->adtyp;
  if (0xb < bVar1) {
    if (bVar1 != 0xc) {
      if (bVar1 != 0x19) {
        if (bVar1 != 0x12) goto LAB_001d150c;
        if (((*(uint *)&mtmp->field_0x60 & 0x20100) == 0x20000) &&
           (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
            ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))))) {
          if ((((youmonst.data != mons + 0x94 && youmonst.data != mons + 0x9d) &&
                u.uprops[0x2a].extrinsic == 0) ||
              (bVar1 = viz_array[mtmp->my][mtmp->mx], (bVar1 & 1) == 0)) ||
             (mtmp->data != mons + 0x127)) {
            if (mtmp->wormno != '\0') {
              bVar4 = worm_known(level,mtmp);
              if (bVar4 == '\0') {
                return 0;
              }
              goto LAB_001d1ede;
            }
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001d1ede;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001d174b;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001d1742;
            }
            else {
LAB_001d1742:
              if (ublindf == (obj *)0x0) {
                return 0;
              }
LAB_001d174b:
              if (ublindf->oartifact != '\x1d') {
                return 0;
              }
            }
            if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) {
              return 0;
            }
            if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
              return 0;
            }
            if ((mtmp->data->mflags3 & 0x200) == 0) {
              return 0;
            }
LAB_001d1ede:
            uVar5 = *(uint *)&mtmp->field_0x60;
            if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar5 & 0x280) != 0) {
                return 0;
              }
            }
            else {
              if ((uVar5 & 0x280) != 0) {
                return 0;
              }
              if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
                return 0;
              }
            }
            if ((u._1052_1_ & 0x20) != 0) {
              return 0;
            }
            if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
              return 0;
            }
            if (u.uprops[8].extrinsic != 0) {
              return 0;
            }
            if (((byte)youmonst.mintrinsics & 0x80) != 0) {
              return 0;
            }
            pcVar8 = mon_nam(mtmp);
            pcVar8 = s_suffix(pcVar8);
            pline("You meet %s gaze.",pcVar8);
            stop_occupation();
            bVar4 = poly_when_stoned(youmonst.data);
            if ((bVar4 != '\0') && (iVar7 = polymon(0x108), iVar7 != 0)) {
              return 0;
            }
            if (u.uprops[0x21].intrinsic == 0) {
              pline("You begin to turn into stone!");
            }
            pcVar8 = mons_mname(mtmp->data);
            delayed_petrify((char *)0x0,pcVar8);
            return 0;
          }
          if (mtmp->wormno == '\0') {
            if ((bVar1 & 2) != 0) goto LAB_001d2166;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001d2023;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001d201a;
            }
            else {
LAB_001d201a:
              if (ublindf == (obj *)0x0) goto LAB_001d21de;
LAB_001d2023:
              if (ublindf->oartifact != '\x1d') goto LAB_001d21de;
            }
            if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001d21de;
            pcVar8 = (char *)0x0;
            bVar3 = true;
            if ((bVar1 & 1) != 0) goto LAB_001d2166;
          }
          else {
            bVar4 = worm_known(level,mtmp);
            if (bVar4 == '\0') {
LAB_001d21de:
              bVar3 = true;
              pcVar8 = (char *)0x0;
            }
            else {
LAB_001d2166:
              uVar5 = *(uint *)&mtmp->field_0x60;
              if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((char)uVar5 < '\0') goto LAB_001d21de;
              }
              else {
                pcVar8 = (char *)0x0;
                bVar3 = true;
                if (((char)uVar5 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                goto LAB_001d21e3;
              }
              pcVar8 = (char *)0x0;
              bVar3 = true;
              if (((uVar5 >> 9 & 1) == 0) && ((u._1052_1_ & 0x20) == 0)) {
                pcVar8 = Monnam(mtmp);
                pcVar8 = s_suffix(pcVar8);
                ureflects("%s gaze is reflected by your %s.",pcVar8);
                pcVar8 = "The gaze is reflected away by %s %s!";
                bVar3 = false;
              }
            }
          }
LAB_001d21e3:
          bVar4 = mon_reflects(mtmp,pcVar8);
          if (bVar4 != '\0') {
            return 0;
          }
          if (((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
                 (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) ||
               (u.uprops[0xd].blocked != 0)) || ((mtmp->data->mflags1 & 0x1000000) != 0)) &&
             ((((u._1052_1_ & 0x22) == 0 && ((mtmp->field_0x61 & 2) == 0)) &&
              ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)))) {
            if (!bVar3) {
              pcVar8 = Monnam(mtmp);
              pline("%s is turned to stone!",pcVar8);
            }
            stoned = '\x01';
            killed(mtmp);
            if (0 < mtmp->mhp) {
              return 0;
            }
            return 2;
          }
          if (bVar3) {
            return 0;
          }
          pcVar9 = Monnam(mtmp);
          iVar7 = pronoun_gender(level,mtmp);
          pcVar8 = genders[iVar7].his;
          line = "%s doesn\'t seem to notice that %s gaze was reflected.";
          goto LAB_001d1fea;
        }
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001d1593;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001d158e;
            }
            else {
LAB_001d158e:
              if (ublindf == (obj *)0x0) {
                return 0;
              }
LAB_001d1593:
              if (ublindf->oartifact != '\x1d') {
                return 0;
              }
            }
            if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) {
              return 0;
            }
            if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
              return 0;
            }
            if ((mtmp->data->mflags3 & 0x200) == 0) {
              return 0;
            }
          }
        }
        else {
          bVar4 = worm_known(level,mtmp);
          if (bVar4 == '\0') {
            return 0;
          }
        }
        uVar5 = *(uint *)&mtmp->field_0x60;
        if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar5 & 0x280) != 0) {
            return 0;
          }
        }
        else {
          if ((uVar5 & 0x280) != 0) {
            return 0;
          }
          if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
            return 0;
          }
        }
        if ((u._1052_1_ & 0x20) != 0) {
          return 0;
        }
        pcVar9 = Monnam(mtmp);
        pcVar8 = "gazes ineffectually";
        if (mtmp->data == mons + 0x127) {
          if ((mtmp->field_0x61 & 1) == 0) {
            if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
               (pcVar8 = "doesn\'t look all that ugly", u.umonnum != u.umonster)) {
              bVar4 = dmgtype(youmonst.data,0x24);
              pcVar8 = "gazes ineffectually";
              if (bVar4 == '\0') {
                pcVar8 = "doesn\'t look all that ugly";
              }
            }
          }
          else {
            pcVar8 = "doesn\'t look all that ugly";
          }
        }
        line = "%s %s.";
LAB_001d1fea:
        pline(line,pcVar9,pcVar8);
        return 0;
      }
      uVar5 = *(uint *)&mtmp->field_0x60;
      if ((uVar5 >> 8 & 1) != 0) {
        return 0;
      }
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001d1643;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001d163a;
          }
          else {
LAB_001d163a:
            if (ublindf == (obj *)0x0) {
              return 0;
            }
LAB_001d1643:
            if (ublindf->oartifact != '\x1d') {
              return 0;
            }
          }
          if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) {
            return 0;
          }
          if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
            return 0;
          }
          if ((mtmp->data->mflags3 & 0x200) == 0) {
            return 0;
          }
        }
      }
      else {
        bVar4 = worm_known(level,mtmp);
        if (bVar4 == '\0') {
          return 0;
        }
        uVar5 = *(uint *)&mtmp->field_0x60;
      }
      if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar5 & 0x280) != 0) {
          return 0;
        }
      }
      else {
        if ((uVar5 & 0x280) != 0) {
          return 0;
        }
        if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
          return 0;
        }
      }
      if ((u._1052_1_ & 0x20) != 0) {
        return 0;
      }
      if ((uVar5 >> 0x11 & 1) == 0) {
        return 0;
      }
      if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
        return 0;
      }
      if (mtmp->mspec_used != 0) {
        return 0;
      }
      uVar5 = mt_random();
      if (uVar5 * -0x33333333 < 0x33333334) {
        return 0;
      }
      iVar11 = 3;
      iVar7 = -3;
      do {
        uVar5 = mt_random();
        iVar11 = iVar11 + (uVar5 & 3);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0);
      iVar7 = mtmp->mspec_used;
      uVar5 = mt_random();
      mtmp->mspec_used = uVar5 % 6 + iVar7 + iVar11;
      if (u.uprops[0x1c].intrinsic == 0) {
        pcVar8 = Monnam(mtmp);
        s_suffix(pcVar8);
        pline("%s gaze confuses you!");
      }
      else {
        pline("You are getting more and more confused.");
      }
      make_confused((ulong)(iVar11 + u.uprops[0x1c].intrinsic),'\0');
      goto LAB_001d210e;
    }
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((uVar5 >> 8 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001d15e9;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001d15e0;
        }
        else {
LAB_001d15e0:
          if (ublindf == (obj *)0x0) {
            return 0;
          }
LAB_001d15e9:
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar4 = worm_known(level,mtmp);
      if (bVar4 == '\0') {
        return 0;
      }
      uVar5 = *(uint *)&mtmp->field_0x60;
    }
    if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar5 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar5 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if ((uVar5 >> 0x11 & 1) == 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if (mtmp->mspec_used != 0) {
      return 0;
    }
    uVar5 = mt_random();
    if (uVar5 * -0x33333333 < 0x33333334) {
      return 0;
    }
    iVar11 = 2;
    iVar7 = -2;
    do {
      uVar5 = mt_random();
      iVar11 = iVar11 + uVar5 % 6;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
    iVar7 = mtmp->mspec_used;
    uVar5 = mt_random();
    mtmp->mspec_used = uVar5 % 6 + iVar7 + iVar11;
    pcVar8 = Monnam(mtmp);
    pline("%s stares piercingly at you!",pcVar8);
    make_stunned((ulong)(iVar11 + u.uprops[0x1b].intrinsic),'\x01');
LAB_001d210e:
    stop_occupation();
    return 0;
  }
  if (bVar1 == 2) {
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((uVar5 >> 8 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001d169d;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001d1694;
        }
        else {
LAB_001d1694:
          if (ublindf == (obj *)0x0) {
            return 0;
          }
LAB_001d169d:
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar4 = worm_known(level,mtmp);
      if (bVar4 == '\0') {
        return 0;
      }
      uVar5 = *(uint *)&mtmp->field_0x60;
    }
    if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar5 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar5 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if ((uVar5 >> 0x11 & 1) == 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if (mtmp->mspec_used != 0) {
      return 0;
    }
    uVar5 = mt_random();
    if (uVar5 * -0x33333333 < 0x33333334) {
      return 0;
    }
    pcVar8 = Monnam(mtmp);
    pline("%s attacks you with a fiery gaze!",pcVar8);
    iVar7 = 2;
    iVar11 = -2;
    do {
      uVar5 = mt_random();
      iVar7 = iVar7 + uVar5 % 6;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0);
    fire_damageu(iVar7,mtmp,(char *)0x0,0,(uint)mtmp->m_lev,'\x01','\0');
    goto LAB_001d210e;
  }
  if (bVar1 != 0xb) {
LAB_001d150c:
    warning("Gaze attack %d?");
    return 0;
  }
  uVar5 = *(uint *)&mtmp->field_0x60;
  if ((uVar5 >> 8 & 1) != 0) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001d16f7;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001d16ee;
      }
      else {
LAB_001d16ee:
        if (ublindf == (obj *)0x0) {
          return 0;
        }
LAB_001d16f7:
        if (ublindf->oartifact != '\x1d') {
          return 0;
        }
      }
      if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return 0;
      }
      if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
        return 0;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return 0;
      }
    }
  }
  else {
    bVar4 = worm_known(level,mtmp);
    if (bVar4 == '\0') {
      return 0;
    }
    uVar5 = *(uint *)&mtmp->field_0x60;
  }
  if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar5 & 0x280) != 0) {
      return 0;
    }
  }
  else {
    if ((uVar5 & 0x280) != 0) {
      return 0;
    }
    if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
      return 0;
    }
  }
  if ((u._1052_1_ & 0x20) != 0) {
    return 0;
  }
  bVar4 = resists_blnd(&youmonst);
  if (bVar4 != '\0') {
    return 0;
  }
  iVar7 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  if (0x40 < iVar7) {
    return 0;
  }
  bVar1 = mattk->damn;
  uVar5 = (uint)bVar1;
  if (bVar1 == 0) {
    xtime = 0;
  }
  else {
    bVar2 = mattk->damd;
    uVar10 = (uint)bVar1;
    do {
      uVar6 = mt_random();
      uVar5 = uVar5 + uVar6 % (uint)bVar2;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    xtime = (ulong)uVar5;
  }
  pcVar8 = mon_nam(mtmp);
  s_suffix(pcVar8);
  pline("You are blinded by %s radiance!");
  make_blinded(xtime,'\0');
  stop_occupation();
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_001d20c9;
      goto LAB_001d207a;
    }
  }
  else {
LAB_001d207a:
    if (ublindf == (obj *)0x0) goto LAB_001d2085;
  }
  if (ublindf->oartifact == '\x1d') {
LAB_001d20c9:
    pline("Your vision quickly clears.");
    return 0;
  }
LAB_001d2085:
  uVar5 = mt_random();
  make_stunned((ulong)(uVar5 % 3 + 1),'\x01');
  return 0;
}

Assistant:

int gazemu(struct monst *mtmp, const struct attack *mattk)
{
	switch(mattk->adtyp) {
	    case AD_STON:
		if (mtmp->mcan || !mtmp->mcansee || Hallucination) {
		    if (!canseemon(level, mtmp)) break;	/* silently */
		    pline("%s %s.", Monnam(mtmp),
			  (mtmp->data == &mons[PM_MEDUSA] &&
			   (mtmp->mcan || Hallucination)) ?
				"doesn't look all that ugly" :
				"gazes ineffectually");
		    break;
		}
		if (Reflecting && couldsee(mtmp->mx, mtmp->my) &&
			mtmp->data == &mons[PM_MEDUSA]) {
		    /* hero has line of sight to Medusa and she's not blind */
		    boolean useeit = canseemon(level, mtmp);

		    if (useeit)
			ureflects("%s gaze is reflected by your %s.",
					 s_suffix(Monnam(mtmp)));
		    if (mon_reflects(mtmp, !useeit ? NULL :
				     "The gaze is reflected away by %s %s!"))
			break;
		    if (!m_canseeu(mtmp)) { /* probably you're invisible */
			if (useeit)
			    pline(
		      "%s doesn't seem to notice that %s gaze was reflected.",
				  Monnam(mtmp), mhis(level, mtmp));
			break;
		    }
		    if (useeit)
			pline("%s is turned to stone!", Monnam(mtmp));
		    stoned = TRUE;
		    killed(mtmp);

		    if (mtmp->mhp > 0) break;
		    return 2;
		}
		if (canseemon(level, mtmp) && couldsee(mtmp->mx, mtmp->my) &&
		    !Stone_resistance) {
		    pline("You meet %s gaze.", s_suffix(mon_nam(mtmp)));
		    stop_occupation();
		    if (poly_when_stoned(youmonst.data) && polymon(PM_STONE_GOLEM))
			break;
		    if (!Stoned) pline("You begin to turn into stone!");
		    delayed_petrify(NULL, mons_mname(mtmp->data));
		}
		break;
	    case AD_CONF:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) &&
		   mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    int conf = dice(3,4);

		    mtmp->mspec_used = mtmp->mspec_used + (conf + rn2(6));
		    if (!Confusion)
			pline("%s gaze confuses you!",
			                  s_suffix(Monnam(mtmp)));
		    else
			pline("You are getting more and more confused.");
		    make_confused(HConfusion + conf, FALSE);
		    stop_occupation();
		}
		break;
	    case AD_STUN:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) &&
		   mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    int stun = dice(2,6);

		    mtmp->mspec_used = mtmp->mspec_used + (stun + rn2(6));
		    pline("%s stares piercingly at you!", Monnam(mtmp));
		    make_stunned(HStun + stun, TRUE);
		    stop_occupation();
		}
		break;
	    case AD_BLND:
		if (!mtmp->mcan && canseemon(level, mtmp) && !resists_blnd(&youmonst)
			&& distu(mtmp->mx,mtmp->my) <= BOLT_LIM*BOLT_LIM) {
		    int blnd = dice((int)mattk->damn, (int)mattk->damd);

		    pline("You are blinded by %s radiance!",
			              s_suffix(mon_nam(mtmp)));
		    make_blinded((long)blnd,FALSE);
		    stop_occupation();
		    /* not blind at this point implies you're wearing
		       the Eyes of the Overworld; make them block this
		       particular stun attack too */
		    if (!Blind) pline("Your vision quickly clears.");
		    else make_stunned((long)dice(1,3),TRUE);
		}
		break;
	    case AD_FIRE:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
			couldsee(mtmp->mx, mtmp->my) &&
			mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    pline("%s attacks you with a fiery gaze!", Monnam(mtmp));
		    fire_damageu(dice(2, 6), mtmp, NULL, 0,
				 mtmp->m_lev, TRUE, FALSE);
		    stop_occupation();
		}
		break;
#ifdef PM_BEHOLDER /* work in progress */
	    case AD_SLEE:
		if (!mtmp->mcan && canseemon(mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) && mtmp->mcansee &&
		   multi >= 0 && !rn2(5) && !FSleep_resistance) {

		    fall_asleep(-rnd(PSleep_resistance ? 5 : 10), TRUE);
		    pline("%s gaze makes you very sleepy...",
			  s_suffix(Monnam(mtmp)));
		}
		break;
	    case AD_SLOW:
		if (!mtmp->mcan && canseemon(mtmp) && mtmp->mcansee &&
		   (HFast & (INTRINSIC|TIMEOUT)) &&
		   !defends(AD_SLOW, uwep) && !rn2(4))

		    u_slow_down();
		    stop_occupation();
		break;
#endif
	    default: warning("Gaze attack %d?", mattk->adtyp);
		break;
	}
	return 0;
}